

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classifier.cpp
# Opt level: O1

void __thiscall GNB::GNB(GNB *this)

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_89;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  undefined1 *local_68 [2];
  undefined1 local_58 [16];
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this->_vptr_GNB = (_func_int **)&PTR__GNB_00107d90;
  local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"left","");
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_68,"keep","");
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"right","");
  __l._M_len = 3;
  __l._M_array = &local_88;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->possible_labels,__l,&local_89);
  lVar1 = 0;
  do {
    if (local_38 + lVar1 != *(undefined1 **)((long)local_48 + lVar1)) {
      operator_delete(*(undefined1 **)((long)local_48 + lVar1));
    }
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x60);
  return;
}

Assistant:

GNB::GNB()
{
  /**
   * TODO: Initialize GNB, if necessary. May depend on your implementation.
   */
}